

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestGIT.cxx
# Opt level: O3

bool __thiscall cmCTestGIT::UpdateInternal(cmCTestGIT *this)

{
  cmCTest *this_00;
  bool bVar1;
  string custom;
  string local_58;
  string local_38;
  
  this_00 = (this->super_cmCTestGlobalVC).super_cmCTestVC.CTest;
  local_58._M_dataplus._M_p = (pointer)&local_58.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_58,"GITUpdateCustom","");
  cmCTest::GetCTestConfiguration(&local_38,this_00,&local_58);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58._M_dataplus._M_p != &local_58.field_2) {
    operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
  }
  if (local_38._M_string_length == 0) {
    bVar1 = UpdateByFetchAndReset(this);
  }
  else {
    bVar1 = UpdateByCustom(this,&local_38);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_38._M_dataplus._M_p != &local_38.field_2) {
    operator_delete(local_38._M_dataplus._M_p,local_38.field_2._M_allocated_capacity + 1);
  }
  return bVar1;
}

Assistant:

bool cmCTestGIT::UpdateInternal()
{
  std::string custom = this->CTest->GetCTestConfiguration("GITUpdateCustom");
  if (!custom.empty()) {
    return this->UpdateByCustom(custom);
  }
  return this->UpdateByFetchAndReset();
}